

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

void HighsHashTree<int,_void>::destroy_recurse(NodePtr node)

{
  ListNode *pLVar1;
  Type TVar2;
  int iVar3;
  ListLeaf *pLVar4;
  InnerLeaf<1> *pIVar5;
  InnerLeaf<2> *pIVar6;
  InnerLeaf<3> *pIVar7;
  InnerLeaf<4> *pIVar8;
  int i;
  int size;
  BranchNode *branch;
  ListNode *next;
  ListNode *iter;
  ListLeaf *leaf;
  int local_30;
  ListNode *local_18;
  NodePtr in_stack_fffffffffffffff0;
  NodePtr local_8;
  
  TVar2 = NodePtr::getType(&local_8);
  switch(TVar2) {
  case kEmpty:
    break;
  case kListLeaf:
    pLVar4 = NodePtr::getListLeaf(&local_8);
    pLVar1 = (pLVar4->first).next;
    if (pLVar4 != (ListLeaf *)0x0) {
      operator_delete(pLVar4);
    }
    while (local_18 = pLVar1, local_18 != (ListNode *)0x0) {
      pLVar1 = local_18->next;
      if (local_18 != (ListNode *)0x0) {
        operator_delete(local_18);
      }
    }
    break;
  case kInnerLeafSizeClass1:
    pIVar5 = NodePtr::getInnerLeafSizeClass1(&local_8);
    if (pIVar5 != (InnerLeaf<1> *)0x0) {
      operator_delete(pIVar5);
    }
    break;
  case kInnerLeafSizeClass2:
    pIVar6 = NodePtr::getInnerLeafSizeClass2(&local_8);
    if (pIVar6 != (InnerLeaf<2> *)0x0) {
      operator_delete(pIVar6);
    }
    break;
  case kInnerLeafSizeClass3:
    pIVar7 = NodePtr::getInnerLeafSizeClass3(&local_8);
    if (pIVar7 != (InnerLeaf<3> *)0x0) {
      operator_delete(pIVar7);
    }
    break;
  case kInnerLeafSizeClass4:
    pIVar8 = NodePtr::getInnerLeafSizeClass4(&local_8);
    if (pIVar8 != (InnerLeaf<4> *)0x0) {
      operator_delete(pIVar8);
    }
    break;
  case kBranchNode:
    NodePtr::getBranchNode(&local_8);
    iVar3 = Occupation::num_set((Occupation *)0x55dc9b);
    for (local_30 = 0; local_30 < iVar3; local_30 = local_30 + 1) {
      destroy_recurse(in_stack_fffffffffffffff0);
    }
    destroyBranchingNode((void *)0x55dce6);
  }
  return;
}

Assistant:

static void destroy_recurse(NodePtr node) {
    switch (node.getType()) {
      case kEmpty:
        break;
      case kListLeaf: {
        ListLeaf* leaf = node.getListLeaf();
        ListNode* iter = leaf->first.next;
        delete leaf;
        while (iter != nullptr) {
          ListNode* next = iter->next;
          delete iter;
          iter = next;
        }

        break;
      }
      case kInnerLeafSizeClass1:
        delete node.getInnerLeafSizeClass1();
        break;
      case kInnerLeafSizeClass2:
        delete node.getInnerLeafSizeClass2();
        break;
      case kInnerLeafSizeClass3:
        delete node.getInnerLeafSizeClass3();
        break;
      case kInnerLeafSizeClass4:
        delete node.getInnerLeafSizeClass4();
        break;
      case kBranchNode: {
        BranchNode* branch = node.getBranchNode();
        int size = branch->occupation.num_set();

        for (int i = 0; i < size; ++i) destroy_recurse(branch->child[i]);

        destroyBranchingNode(branch);
      }
    }
  }